

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fOcclusionQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::OcclusionQueryCase::iterate(OcclusionQueryCase *this)

{
  int *value;
  Random *this_00;
  TextureFormat TVar1;
  RenderContext *context;
  deUint32 dVar2;
  GLint location;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  GLenum GVar10;
  RenderTarget *pRVar11;
  MessageBuilder *pMVar12;
  TestError *this_01;
  uint *rnd;
  Random *rnd_00;
  Surface *surface;
  ulong uVar13;
  void *__buf;
  IterateResult IVar14;
  char *pcVar15;
  int *value_00;
  char *pcVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  OcclusionQueryCase *pOVar20;
  int i;
  bool bVar21;
  float minZ;
  float in_XMM4_Da;
  allocator<char> local_2ea;
  allocator<char> local_2e9;
  OcclusionQueryCase *local_2e8;
  ulong local_2e0;
  ulong local_2d8;
  int *local_2d0;
  vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
  occOptions;
  vector<float,_std::allocator<float>_> targetVertices;
  vector<float,_std::allocator<float>_> occluderVertices;
  Surface pixels;
  vector<unsigned_int,_std::allocator<unsigned_int>_> queryIds;
  string local_228;
  deUint32 resultAvailable;
  ChannelType CStack_204;
  ostringstream local_200 [376];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  string local_50;
  
  TVar1 = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar11 = Context::getRenderTarget((this->super_TestCase).m_context);
  location = glwGetUniformLocation((this->m_program->m_program).m_program,"u_color");
  occluderVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  occluderVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  occluderVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  targetVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  targetVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  targetVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  _resultAvailable = (TextureFormat)((ulong)CStack_204 << 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&queryIds,1,&resultAvailable,(allocator_type *)&local_228);
  local_2d8 = (ulong)(uint)pRVar11->m_width;
  local_2e0 = (ulong)(uint)pRVar11->m_height;
  _resultAvailable = TVar1;
  std::__cxx11::ostringstream::ostringstream(local_200);
  std::operator<<((ostream *)local_200,"Case iteration ");
  std::ostream::operator<<(local_200,this->m_iterNdx + 1);
  std::operator<<((ostream *)local_200," / ");
  pMVar12 = tcu::MessageBuilder::operator<<((MessageBuilder *)&resultAvailable,&NUM_CASE_ITERATIONS)
  ;
  tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_200);
  _resultAvailable = TVar1;
  std::__cxx11::ostringstream::ostringstream(local_200);
  std::operator<<((ostream *)local_200,"Parameters:\n");
  std::operator<<((ostream *)local_200,"- ");
  value_00 = &this->m_numOccluderDraws;
  pMVar12 = tcu::MessageBuilder::operator<<((MessageBuilder *)&resultAvailable,value_00);
  std::operator<<((ostream *)&pMVar12->m_str," occluder draws, ");
  value = &this->m_numOccludersPerDraw;
  pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,value);
  std::operator<<((ostream *)&pMVar12->m_str," primitive writes per draw,\n");
  std::operator<<((ostream *)&pMVar12->m_str,"- ");
  pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&this->m_numTargetDraws);
  std::operator<<((ostream *)&pMVar12->m_str," target draws, ");
  pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&this->m_numTargetsPerDraw);
  std::operator<<((ostream *)&pMVar12->m_str," targets per draw\n");
  tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_200);
  minZ = 1.0;
  glwClearColor(0.0,0.0,0.0,1.0);
  glwClearDepthf(1.0);
  glwClearStencil(0);
  glwClear(0x4500);
  glwUseProgram((this->m_program->m_program).m_program);
  glwEnableVertexAttribArray(0);
  std::
  vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
  ::vector(&occOptions,0,(allocator_type *)&resultAvailable);
  uVar3 = this->m_occluderTypes;
  if ((uVar3 & 2) != 0) {
    resultAvailable = I;
    std::
    vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
    ::emplace_back<deqp::gles3::Functional::OccluderType>(&occOptions,&resultAvailable);
    uVar3 = this->m_occluderTypes;
  }
  if ((uVar3 & 4) != 0) {
    resultAvailable = LA;
    std::
    vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
    ::emplace_back<deqp::gles3::Functional::OccluderType>(&occOptions,&resultAvailable);
    uVar3 = this->m_occluderTypes;
  }
  if ((uVar3 & 8) != 0) {
    resultAvailable = RGBA;
    std::
    vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
    ::emplace_back<deqp::gles3::Functional::OccluderType>(&occOptions,&resultAvailable);
    uVar3 = this->m_occluderTypes;
  }
  if ((uVar3 & 0x10) != 0) {
    resultAvailable = sBGR;
    std::
    vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
    ::emplace_back<deqp::gles3::Functional::OccluderType>(&occOptions,&resultAvailable);
  }
  this_00 = &this->m_rnd;
  iVar4 = (int)local_2d8 + 100;
  iVar5 = (int)local_2e0 + 100;
  iVar19 = 0;
  local_2e8 = this;
  local_2d0 = value_00;
  while ((iVar19 < *value_00 &&
         (occOptions.
          super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          occOptions.
          super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
          ._M_impl.super__Vector_impl_data._M_finish))) {
    iVar6 = de::Random::getInt(this_00,0,
                               (int)((ulong)((long)occOptions.
                                                                                                      
                                                  super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)occOptions.
                                                  super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) +
                               -1);
    rnd = &switchD_005ac3d2::switchdataD_009be05c;
    switch(occOptions.
           super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar6] - OCCLUDER_DEPTH_WRITE >> 1 |
           (uint)((occOptions.
                   super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar6] - OCCLUDER_DEPTH_WRITE & 1) != 0
                 ) << 0x1f) {
    case 0:
      _resultAvailable = TVar1;
      std::__cxx11::ostringstream::ostringstream(local_200);
      std::operator<<((ostream *)local_200,"Occluder draw ");
      iVar19 = iVar19 + 1;
      std::ostream::operator<<(local_200,iVar19);
      std::operator<<((ostream *)local_200," / ");
      pMVar12 = tcu::MessageBuilder::operator<<((MessageBuilder *)&resultAvailable,value_00);
      std::operator<<((ostream *)&pMVar12->m_str," : ");
      std::operator<<((ostream *)&pMVar12->m_str,"Depth write");
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_200);
      local_68._0_4_ = (this_00->m_rnd).x;
      local_68._4_4_ = (this_00->m_rnd).y;
      uStack_60._0_4_ = (this->m_rnd).m_rnd.z;
      uStack_60._4_4_ = (this->m_rnd).m_rnd.w;
      generateVertices(&occluderVertices,local_2e8->m_occluderSize,0.0,
                       local_2e8->m_numOccludersPerDraw,(int)&local_68,(Random *)rnd,0.6,minZ,
                       in_XMM4_Da);
      glwEnable(0xb71);
      minZ = 1.0;
      glwUniform4f(location,0.0,0.0,1.0,1.0);
      glwVertexAttribPointer
                (0,4,0x1406,'\0',0,
                 occluderVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start);
      glwDrawArrays(4,0,*value * 3);
      glwDisable(0xb71);
      break;
    case OCCLUDER_SCISSOR:
      iVar6 = de::Random::getInt(this_00,-100,(int)local_2d8);
      iVar7 = de::Random::getInt(this_00,-100,(int)local_2e0);
      iVar8 = de::Random::getInt(this_00,100,iVar4);
      iVar9 = de::Random::getInt(this_00,100,iVar5);
      _resultAvailable = TVar1;
      std::__cxx11::ostringstream::ostringstream(local_200);
      std::operator<<((ostream *)local_200,"Occluder draw ");
      iVar19 = iVar19 + 1;
      std::ostream::operator<<(local_200,iVar19);
      std::operator<<((ostream *)local_200," / ");
      pMVar12 = tcu::MessageBuilder::operator<<((MessageBuilder *)&resultAvailable,local_2d0);
      std::operator<<((ostream *)&pMVar12->m_str," : ");
      std::operator<<((ostream *)&pMVar12->m_str,"Depth clear");
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_200);
      _resultAvailable = TVar1;
      std::__cxx11::ostringstream::ostringstream(local_200);
      std::operator<<((ostream *)local_200,"Depth-clearing box drawn at ");
      value_00 = local_2d0;
      std::operator<<((ostream *)local_200,"(");
      std::ostream::operator<<(local_200,iVar6);
      std::operator<<((ostream *)local_200,", ");
      std::ostream::operator<<(local_200,iVar7);
      std::operator<<((ostream *)local_200,")");
      std::operator<<((ostream *)local_200,", width = ");
      std::ostream::operator<<(local_200,iVar8);
      std::operator<<((ostream *)local_200,", height = ");
      std::ostream::operator<<(local_200,iVar9);
      std::operator<<((ostream *)local_200,".");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&resultAvailable,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_200);
      glwEnable(0xc11);
      glwScissor(iVar6,iVar7,iVar8,iVar9);
      glwClearDepthf(0.0);
      minZ = 1.0;
      glwClearColor(0.0,0.5,0.8,1.0);
      glwClear(0x4100);
      glwDisable(0xc11);
      break;
    default:
      iVar19 = iVar19 + 1;
      break;
    case OCCLUDER_DEPTH_WRITE|OCCLUDER_SCISSOR:
      _resultAvailable = TVar1;
      std::__cxx11::ostringstream::ostringstream(local_200);
      std::operator<<((ostream *)local_200,"Occluder draw ");
      iVar19 = iVar19 + 1;
      std::ostream::operator<<(local_200,iVar19);
      std::operator<<((ostream *)local_200," / ");
      pMVar12 = tcu::MessageBuilder::operator<<((MessageBuilder *)&resultAvailable,value_00);
      std::operator<<((ostream *)&pMVar12->m_str," : ");
      std::operator<<((ostream *)&pMVar12->m_str,"Stencil write");
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_200);
      local_78._0_4_ = (this_00->m_rnd).x;
      local_78._4_4_ = (this_00->m_rnd).y;
      uStack_70._0_4_ = (this->m_rnd).m_rnd.z;
      uStack_70._4_4_ = (this->m_rnd).m_rnd.w;
      generateVertices(&occluderVertices,local_2e8->m_occluderSize,0.0,
                       local_2e8->m_numOccludersPerDraw,(int)&local_78,(Random *)rnd,0.6,minZ,
                       in_XMM4_Da);
      glwStencilFunc(0x207,1,0xff);
      glwStencilOp(0x1e00,0x1e00,0x1e01);
      glwEnable(0xb90);
      minZ = 1.0;
      glwUniform4f(location,0.0,1.0,0.0,1.0);
      glwVertexAttribPointer
                (0,4,0x1406,'\0',0,
                 occluderVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start);
      glwDrawArrays(4,0,*value * 3);
      glwDisable(0xb90);
      break;
    case OCCLUDER_DEPTH_CLEAR|OCCLUDER_DEPTH_WRITE|OCCLUDER_SCISSOR:
      iVar6 = de::Random::getInt(this_00,-100,(int)local_2d8);
      iVar7 = de::Random::getInt(this_00,-100,(int)local_2e0);
      iVar8 = de::Random::getInt(this_00,100,iVar4);
      iVar9 = de::Random::getInt(this_00,100,iVar5);
      _resultAvailable = TVar1;
      std::__cxx11::ostringstream::ostringstream(local_200);
      std::operator<<((ostream *)local_200,"Occluder draw ");
      iVar19 = iVar19 + 1;
      std::ostream::operator<<(local_200,iVar19);
      std::operator<<((ostream *)local_200," / ");
      pMVar12 = tcu::MessageBuilder::operator<<((MessageBuilder *)&resultAvailable,local_2d0);
      std::operator<<((ostream *)&pMVar12->m_str," : ");
      std::operator<<((ostream *)&pMVar12->m_str,"Stencil clear");
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_200);
      _resultAvailable = TVar1;
      std::__cxx11::ostringstream::ostringstream(local_200);
      std::operator<<((ostream *)local_200,"Stencil-clearing box drawn at ");
      value_00 = local_2d0;
      std::operator<<((ostream *)local_200,"(");
      std::ostream::operator<<(local_200,iVar6);
      std::operator<<((ostream *)local_200,", ");
      std::ostream::operator<<(local_200,iVar7);
      std::operator<<((ostream *)local_200,")");
      std::operator<<((ostream *)local_200,", width = ");
      std::ostream::operator<<(local_200,iVar8);
      std::operator<<((ostream *)local_200,", height = ");
      std::ostream::operator<<(local_200,iVar9);
      std::operator<<((ostream *)local_200,".");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&resultAvailable,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_200);
      glwEnable(0xc11);
      glwScissor(iVar6,iVar7,iVar8,iVar9);
      glwClearStencil(1);
      minZ = 1.0;
      glwClearColor(0.0,0.8,0.5,1.0);
      glwClear(0x4400);
      glwDisable(0xc11);
    }
  }
  pOVar20 = local_2e8;
  if ((local_2e8->m_occluderTypes & 1) != 0) {
    iVar19 = de::Random::getInt(this_00,-100,(int)local_2d8 + -100);
    iVar6 = de::Random::getInt(this_00,-100,(int)local_2e0 + -100);
    iVar4 = de::Random::getInt(this_00,0xfa,iVar4);
    iVar5 = de::Random::getInt(this_00,0xfa,iVar5);
    _resultAvailable = TVar1;
    std::__cxx11::ostringstream::ostringstream(local_200);
    std::operator<<((ostream *)local_200,"Scissor box drawn at ");
    std::operator<<((ostream *)local_200,"(");
    std::ostream::operator<<(local_200,iVar19);
    std::operator<<((ostream *)local_200,", ");
    std::ostream::operator<<(local_200,iVar6);
    std::operator<<((ostream *)local_200,")");
    std::operator<<((ostream *)local_200,", width = ");
    std::ostream::operator<<(local_200,iVar4);
    std::operator<<((ostream *)local_200,", height = ");
    std::ostream::operator<<(local_200,iVar5);
    std::operator<<((ostream *)local_200,".");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&resultAvailable,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_200);
    glwEnable(0xc11);
    pOVar20 = local_2e8;
    glwScissor(iVar19,iVar6,iVar4,iVar5);
  }
  glwGenQueries(1,queryIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start);
  glwBeginQuery(pOVar20->m_queryMode,
                *queryIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start);
  GVar10 = glwGetError();
  rnd_00 = (Random *)0x154;
  glu::checkError(GVar10,"Occlusion query started",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fOcclusionQueryTests.cpp"
                  ,0x154);
  glwEnable(0xb71);
  glwEnable(0xb90);
  glwStencilFunc(0x202,0,0xff);
  for (iVar4 = 0; iVar4 < this->m_numTargetDraws; iVar4 = iVar4 + 1) {
    local_88._0_4_ = (this_00->m_rnd).x;
    local_88._4_4_ = (this_00->m_rnd).y;
    uStack_80._0_4_ = (this->m_rnd).m_rnd.z;
    uStack_80._4_4_ = (this->m_rnd).m_rnd.w;
    generateVertices(&targetVertices,pOVar20->m_targetSize,0.4,pOVar20->m_numTargetsPerDraw,
                     (int)&local_88,rnd_00,1.0,minZ,in_XMM4_Da);
    if (targetVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start !=
        targetVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      minZ = 1.0;
      glwUniform4f(location,1.0,0.0,0.0,1.0);
      rnd_00 = (Random *)0x0;
      glwVertexAttribPointer
                (0,4,0x1406,'\0',0,
                 targetVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start);
      glwDrawArrays(4,0,this->m_numTargetsPerDraw * 3);
    }
  }
  glwEndQuery(pOVar20->m_queryMode);
  glwFinish();
  glwDisable(0xc11);
  glwDisable(0xb90);
  glwDisable(0xb71);
  _resultAvailable = (TextureFormat)((ulong)_resultAvailable & 0xffffffff00000000);
  glwGetQueryObjectuiv
            (*queryIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start,0x8867,&resultAvailable);
  if (resultAvailable == 0) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Occlusion query failed to return a result after glFinish()",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fOcclusionQueryTests.cpp"
               ,0x174);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  _resultAvailable = (TextureFormat)((ulong)_resultAvailable & 0xffffffff00000000);
  glwGetQueryObjectuiv
            (*queryIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start,0x8866,&resultAvailable);
  dVar2 = resultAvailable;
  glwDeleteQueries(1,queryIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  GVar10 = glwGetError();
  glu::checkError(GVar10,"Occlusion query finished",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fOcclusionQueryTests.cpp"
                  ,0x17f);
  tcu::Surface::Surface(&pixels,pRVar11->m_width,pRVar11->m_height);
  context = ((pOVar20->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)&resultAvailable,&pixels);
  iVar4 = 0;
  glu::readPixels(context,0,0,(PixelBufferAccess *)&resultAvailable);
  uVar13 = 0;
  if (0 < pixels.m_width) {
    uVar13 = (ulong)(uint)pixels.m_width;
  }
  iVar5 = 0;
  if (0 < pixels.m_height) {
    iVar5 = pixels.m_height;
  }
  for (iVar19 = 0; uVar17 = uVar13, iVar6 = iVar4, iVar19 != iVar5; iVar19 = iVar19 + 1) {
    while (bVar21 = uVar17 != 0, uVar17 = uVar17 - 1, bVar21) {
      lVar18 = (long)iVar6;
      iVar6 = iVar6 + 1;
      if (*(char *)((long)pixels.m_pixels.m_ptr + lVar18 * 4) != '\0') goto LAB_005acea6;
    }
    iVar4 = iVar4 + pixels.m_width;
  }
LAB_005acea6:
  _resultAvailable = TVar1;
  std::__cxx11::ostringstream::ostringstream(local_200);
  std::operator<<((ostream *)local_200,"Occlusion query result:  Target ");
  pcVar15 = "invisible";
  pcVar16 = "invisible";
  if (dVar2 != 0) {
    pcVar16 = "visible";
  }
  std::operator<<((ostream *)local_200,pcVar16);
  std::operator<<((ostream *)local_200,"\n");
  std::operator<<((ostream *)local_200,"Framebuffer read result: Target ");
  if (iVar19 < pixels.m_height) {
    pcVar15 = "visible";
  }
  std::operator<<((ostream *)local_200,pcVar15);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&resultAvailable,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_200);
  pOVar20 = local_2e8;
  if (local_2e8->m_queryMode == 0x8d6a) {
    if (dVar2 != 0 || pixels.m_height <= iVar19) {
LAB_005ad05f:
      _resultAvailable = TVar1;
      std::__cxx11::ostringstream::ostringstream(local_200);
      std::operator<<((ostream *)local_200,"Case passed!");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&resultAvailable,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_200);
      iVar4 = pOVar20->m_iterNdx + 1;
      pOVar20->m_iterNdx = iVar4;
      IVar14 = (IterateResult)(iVar4 < 10);
      goto LAB_005ad0bb;
    }
  }
  else if ((dVar2 != 0) == iVar19 < pixels.m_height) goto LAB_005ad05f;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"Result image",&local_2e9)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Result image",&local_2ea);
  surface = &pixels;
  tcu::LogImage::LogImage
            ((LogImage *)&resultAvailable,&local_228,&local_50,surface,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)&resultAvailable,TVar1.order,__buf,(size_t)surface);
  tcu::LogImage::~LogImage((LogImage *)&resultAvailable);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_228);
  _resultAvailable = TVar1;
  std::__cxx11::ostringstream::ostringstream(local_200);
  std::operator<<((ostream *)local_200,"Case FAILED!");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&resultAvailable,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_200);
  IVar14 = STOP;
  tcu::TestContext::setTestResult
            ((pOVar20->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
             "Fail");
LAB_005ad0bb:
  tcu::Surface::~Surface(&pixels);
  std::
  _Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
  ::~_Vector_base(&occOptions.
                   super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
                 );
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&queryIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&targetVertices.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&occluderVertices.super__Vector_base<float,_std::allocator<float>_>);
  return IVar14;
}

Assistant:

OcclusionQueryCase::IterateResult OcclusionQueryCase::iterate (void)
{
	tcu::TestLog&				log					= m_testCtx.getLog();
	const tcu::RenderTarget&	renderTarget		= m_context.getRenderTarget();
	deUint32					colorUnif			= glGetUniformLocation(m_program->getProgram(), "u_color");

	std::vector<float>			occluderVertices;
	std::vector<float>			targetVertices;
	std::vector<deUint32>		queryIds(1, 0);
	bool						queryResult			= false;
	bool						colorReadResult		= false;
	int							targetW				= renderTarget.getWidth();
	int							targetH				= renderTarget.getHeight();

	log << tcu::TestLog::Message << "Case iteration " << m_iterNdx+1 << " / " << NUM_CASE_ITERATIONS << tcu::TestLog::EndMessage;
	log << tcu::TestLog::Message << "Parameters:\n"
								 << "- " << m_numOccluderDraws	<< " occluder draws, "	<< m_numOccludersPerDraw	<< " primitive writes per draw,\n"
								 << "- " << m_numTargetDraws	<< " target draws, "	<< m_numTargetsPerDraw		<< " targets per draw\n"
		<< tcu::TestLog::EndMessage;

	DE_ASSERT(m_program);

	glClearColor				(0.0f, 0.0f, 0.0f, 1.0f);
	glClearDepthf				(1.0f);
	glClearStencil				(0);
	glClear						(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
	glUseProgram				(m_program->getProgram());
	glEnableVertexAttribArray	(0);

	// Draw occluders

	std::vector<OccluderType> occOptions(0);
	if (m_occluderTypes & OCCLUDER_DEPTH_WRITE)		occOptions.push_back(OCCLUDER_DEPTH_WRITE);
	if (m_occluderTypes & OCCLUDER_DEPTH_CLEAR)		occOptions.push_back(OCCLUDER_DEPTH_CLEAR);
	if (m_occluderTypes & OCCLUDER_STENCIL_WRITE)	occOptions.push_back(OCCLUDER_STENCIL_WRITE);
	if (m_occluderTypes & OCCLUDER_STENCIL_CLEAR)	occOptions.push_back(OCCLUDER_STENCIL_CLEAR);

	for (int i = 0; i < m_numOccluderDraws; i++)
	{
		if (occOptions.empty())
			break;

		OccluderType type = occOptions[m_rnd.getInt(0, (int)occOptions.size()-1)];	// Choosing a random occluder type from available options

		switch (type)
		{
			case OCCLUDER_DEPTH_WRITE:
				log << tcu::TestLog::Message	<< "Occluder draw "	<< i+1 << " / " << m_numOccluderDraws << " : "
												<< "Depth write"	<< tcu::TestLog::EndMessage;

				generateVertices(occluderVertices, 2.0f, 2.0f, m_numOccludersPerDraw, 3, m_rnd, m_occluderSize, 0.0f, 0.6f);	// Generate vertices for occluding primitives

				DE_ASSERT(!occluderVertices.empty());

				glEnable				(GL_DEPTH_TEST);
				glUniform4f				(colorUnif, DEPTH_WRITE_COLOR.x(), DEPTH_WRITE_COLOR.y(), DEPTH_WRITE_COLOR.z(), DEPTH_WRITE_COLOR.w());
				glVertexAttribPointer	(0, ELEMENTS_PER_VERTEX, GL_FLOAT, GL_FALSE, 0, &occluderVertices[0]);
				glDrawArrays			(GL_TRIANGLES, 0, 3*m_numOccludersPerDraw);
				glDisable				(GL_DEPTH_TEST);

				break;

			case OCCLUDER_DEPTH_CLEAR:
			{
				int scissorBoxX = m_rnd.getInt(-DEPTH_CLEAR_OFFSET,	targetW);
				int scissorBoxY = m_rnd.getInt(-DEPTH_CLEAR_OFFSET,	targetH);
				int scissorBoxW = m_rnd.getInt( DEPTH_CLEAR_OFFSET,	targetW+DEPTH_CLEAR_OFFSET);
				int scissorBoxH = m_rnd.getInt( DEPTH_CLEAR_OFFSET,	targetH+DEPTH_CLEAR_OFFSET);

				log << tcu::TestLog::Message	<< "Occluder draw "	<< i+1 << " / " << m_numOccluderDraws << " : "	<< "Depth clear"
					<< tcu::TestLog::EndMessage;
				log << tcu::TestLog::Message	<< "Depth-clearing box drawn at "
												<< "("			<< scissorBoxX << ", "			<< scissorBoxY << ")"
												<< ", width = "	<< scissorBoxW << ", height = " << scissorBoxH << "."
					<< tcu::TestLog::EndMessage;

				glEnable		(GL_SCISSOR_TEST);
				glScissor		(scissorBoxX, scissorBoxY, scissorBoxW, scissorBoxH);
				glClearDepthf	(0.0f);
				glClearColor	(DEPTH_CLEAR_COLOR.x(), DEPTH_CLEAR_COLOR.y(), DEPTH_CLEAR_COLOR.z(), DEPTH_CLEAR_COLOR.w());
				glClear			(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
				glDisable		(GL_SCISSOR_TEST);

				break;
			}

			case OCCLUDER_STENCIL_WRITE:
				log << tcu::TestLog::Message	<< "Occluder draw "	<< i+1 << " / " << m_numOccluderDraws << " : "
												<< "Stencil write"	<< tcu::TestLog::EndMessage;

				generateVertices(occluderVertices, 2.0f, 2.0f, m_numOccludersPerDraw, 3, m_rnd, m_occluderSize, 0.0f, 0.6f);

				glStencilFunc	(GL_ALWAYS, 1, 0xFF);
				glStencilOp		(GL_KEEP, GL_KEEP, GL_REPLACE);

				DE_ASSERT(!occluderVertices.empty());

				glEnable				(GL_STENCIL_TEST);
				glUniform4f				(colorUnif, STENCIL_WRITE_COLOR.x(), STENCIL_WRITE_COLOR.y(), STENCIL_WRITE_COLOR.z(), STENCIL_WRITE_COLOR.w());
				glVertexAttribPointer	(0, ELEMENTS_PER_VERTEX, GL_FLOAT, GL_FALSE, 0, &occluderVertices[0]);
				glDrawArrays			(GL_TRIANGLES, 0, 3*m_numOccludersPerDraw);
				glDisable				(GL_STENCIL_TEST);

				break;

			case OCCLUDER_STENCIL_CLEAR:
			{
				int scissorBoxX = m_rnd.getInt(-STENCIL_CLEAR_OFFSET,	targetW);
				int scissorBoxY = m_rnd.getInt(-STENCIL_CLEAR_OFFSET,	targetH);
				int scissorBoxW = m_rnd.getInt(	STENCIL_CLEAR_OFFSET,	targetW+STENCIL_CLEAR_OFFSET);
				int scissorBoxH = m_rnd.getInt(	STENCIL_CLEAR_OFFSET,	targetH+STENCIL_CLEAR_OFFSET);

				log << tcu::TestLog::Message	<< "Occluder draw "	<< i+1 << " / " << m_numOccluderDraws << " : "	<< "Stencil clear"
					<< tcu::TestLog::EndMessage;
				log << tcu::TestLog::Message	<< "Stencil-clearing box drawn at "
												<< "("			<< scissorBoxX << ", "			<< scissorBoxY << ")"
												<< ", width = "	<< scissorBoxW << ", height = " << scissorBoxH << "."
					<< tcu::TestLog::EndMessage;

				glEnable		(GL_SCISSOR_TEST);
				glScissor		(scissorBoxX, scissorBoxY, scissorBoxW, scissorBoxH);
				glClearStencil	(1);
				glClearColor	(STENCIL_CLEAR_COLOR.x(), STENCIL_CLEAR_COLOR.y(), STENCIL_CLEAR_COLOR.z(), STENCIL_CLEAR_COLOR.w());
				glClear			(GL_COLOR_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
				glDisable		(GL_SCISSOR_TEST);

				break;
			}

			default:
				DE_ASSERT(false);
				break;
		}
	}

	if (m_occluderTypes & OCCLUDER_SCISSOR)
	{
		int scissorBoxX = m_rnd.getInt(-SCISSOR_OFFSET,	targetW-SCISSOR_OFFSET);
		int scissorBoxY = m_rnd.getInt(-SCISSOR_OFFSET,	targetH-SCISSOR_OFFSET);
		int scissorBoxW = m_rnd.getInt(SCISSOR_MINSIZE,	targetW+SCISSOR_OFFSET);
		int scissorBoxH = m_rnd.getInt(SCISSOR_MINSIZE,	targetH+SCISSOR_OFFSET);

		log << tcu::TestLog::Message	<< "Scissor box drawn at "
										<< "("			<< scissorBoxX << ", "			<< scissorBoxY << ")"
										<< ", width = "	<< scissorBoxW << ", height = " << scissorBoxH << "."
			<< tcu::TestLog::EndMessage;

		glEnable	(GL_SCISSOR_TEST);
		glScissor	(scissorBoxX, scissorBoxY, scissorBoxW, scissorBoxH);
	}

	glGenQueries	(1, &queryIds[0]);
	glBeginQuery	(m_queryMode, queryIds[0]);
	GLU_CHECK_MSG	("Occlusion query started");

	// Draw target primitives

	glEnable		(GL_DEPTH_TEST);
	glEnable		(GL_STENCIL_TEST);
	glStencilFunc	(GL_EQUAL, 0, 0xFF);

	for (int i = 0; i < m_numTargetDraws; i++)
	{
		generateVertices(targetVertices, 2.0f, 2.0f, m_numTargetsPerDraw, 3,  m_rnd, m_targetSize, 0.4f, 1.0f);		// Generate vertices for target primitives

		if (!targetVertices.empty())
		{
			glUniform4f				(colorUnif, TARGET_COLOR.x(), TARGET_COLOR.y(), TARGET_COLOR.z(), TARGET_COLOR.w());
			glVertexAttribPointer	(0, ELEMENTS_PER_VERTEX, GL_FLOAT, GL_FALSE, 0, &targetVertices[0]);
			glDrawArrays			(GL_TRIANGLES, 0, 3*m_numTargetsPerDraw);
		}
	}

	glEndQuery		(m_queryMode);
	glFinish		();
	glDisable		(GL_SCISSOR_TEST);
	glDisable		(GL_STENCIL_TEST);
	glDisable		(GL_DEPTH_TEST);

	// Check that query result is available.
	{
		deUint32 resultAvailable = GL_FALSE;
		glGetQueryObjectuiv(queryIds[0], GL_QUERY_RESULT_AVAILABLE, &resultAvailable);

		if (resultAvailable == GL_FALSE)
			TCU_FAIL("Occlusion query failed to return a result after glFinish()");
	}

	// Read query result.
	{
		deUint32 result = 0;
		glGetQueryObjectuiv(queryIds[0], GL_QUERY_RESULT, &result);
		queryResult = (result != GL_FALSE);
	}

	glDeleteQueries	(1, &queryIds[0]);
	GLU_CHECK_MSG	("Occlusion query finished");

	// Read pixel data

	tcu::Surface pixels(renderTarget.getWidth(), renderTarget.getHeight());
	glu::readPixels(m_context.getRenderContext(), 0, 0, pixels.getAccess());

	{
		int width = pixels.getWidth();
		int height = pixels.getHeight();

		for (int y = 0; y < height; y++)
		{
			for (int x = 0; x < width; x++)
			{
				if (pixels.getPixel(x,y).getRed() != 0)
				{
					colorReadResult = true;
					break;
				}
			}
			if (colorReadResult) break;
		}
	}

	log << tcu::TestLog::Message << "Occlusion query result:  Target " << (queryResult		? "visible" : "invisible") << "\n"
								 << "Framebuffer read result: Target " << (colorReadResult	? "visible" : "invisible") << tcu::TestLog::EndMessage;

	bool testOk = false;
	if (m_queryMode == GL_ANY_SAMPLES_PASSED_CONSERVATIVE)
	{
		if (queryResult || colorReadResult)
			testOk = queryResult;	// Allow conservative occlusion query to return false positives.
		else
			testOk = queryResult == colorReadResult;
	}
	else
		testOk = (queryResult == colorReadResult);

	if (!testOk)
	{
		log << tcu::TestLog::Image("Result image", "Result image", pixels);
		log << tcu::TestLog::Message << "Case FAILED!" << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	log << tcu::TestLog::Message << "Case passed!" << tcu::TestLog::EndMessage;

	return (++m_iterNdx < NUM_CASE_ITERATIONS) ? CONTINUE : STOP;
}